

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O3

void __thiscall
Iir::RBJ::BandShelf::setupN(BandShelf *this,double centerFrequency,double gainDb,double bandWidth)

{
  invalid_argument *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = pow(10.0,gainDb / 40.0);
  dVar2 = centerFrequency * 6.283185307179586;
  dVar3 = cos(dVar2);
  dVar4 = sin(dVar2);
  dVar2 = sinh((bandWidth * 0.34657359027997264 * dVar2) / dVar4);
  dVar2 = dVar2 * dVar4;
  if (!NAN(dVar2)) {
    Biquad::setCoefficients
              ((Biquad *)this,dVar2 / dVar1 + 1.0,dVar3 * -2.0,1.0 - dVar2 / dVar1,
               dVar2 * dVar1 + 1.0,dVar3 * -2.0,1.0 - dVar2 * dVar1);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"No solution available for these parameters.\n");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void BandShelf::setupN (double centerFrequency,
			       double gainDb,
			       double bandWidth)
	{
		double A  = pow (10, gainDb/40);
		double w0 = 2 * doublePi * centerFrequency;
		double cs = cos(w0);
		double sn = sin(w0);
		double AL = sn * sinh( doubleLn2/2 * bandWidth * w0/sn );
		if (Iir::is_nan (AL))
			throw_invalid_argument("No solution available for these parameters.\n");
		double b0 =  1 + AL * A;
		double b1 = -2 * cs;
		double b2 =  1 - AL * A;
		double a0 =  1 + AL / A;
		double a1 = -2 * cs;
		double a2 =  1 - AL / A;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}